

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetImageWidget.cpp
# Opt level: O3

void __thiscall TargetImageWidget::LoadImage(TargetImageWidget *this,QString *fileName)

{
  int *piVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QArrayData *local_78 [2];
  undefined8 local_68;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined8 local_28;
  
  cVar2 = QImage::load((QString *)&this->image_,(char *)fileName);
  if (cVar2 != '\0') {
    PanAndZoomWidget::ResetView(&this->super_PanAndZoomWidget);
    PanAndZoomWidget::ResetTranslation(&this->super_PanAndZoomWidget);
    onFitToTargetRequested(this);
    lVar4 = QImage::size();
    if (lVar4 == 0x100000001000) {
      QVar5.m_data = (storage_type *)0x12;
      QVar5.m_size = (qsizetype)&local_38;
      QString::fromUtf8(QVar5);
      local_78[0] = (QArrayData *)CONCAT44(uStack_34,local_38);
      local_68 = local_28;
      QVar6.m_data = (storage_type *)0x62;
      QVar6.m_size = (qsizetype)&local_38;
      QString::fromUtf8(QVar6);
      local_58 = local_38;
      uStack_54 = uStack_34;
      uStack_50 = uStack_30;
      uStack_4c = uStack_2c;
      local_48 = local_28;
      iVar3 = QMessageBox::question(this,local_78,&local_58,0x14000,0);
      piVar1 = (int *)CONCAT44(uStack_54,local_58);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_54,local_58),2,8);
        }
      }
      if (local_78[0] != (QArrayData *)0x0) {
        LOCK();
        (local_78[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_78[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_78[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_78[0],2,8);
        }
      }
      if (iVar3 == 0x4000) {
        onUseWholeImageRequested(this);
      }
    }
  }
  return;
}

Assistant:

void TargetImageWidget::LoadImage(QString fileName)
{
    if (image_.load(fileName)) {
        ResetView();
        onResetTranslationRequested();
        onFitToTargetRequested();

        if (image_.size() == QSize(4096, 4096)) {
            int response = QMessageBox::question(this, "Skip modification?", "This image is already 4096 * 4096 pixels, would you like to set this as the target image directly?");
            if (response == QMessageBox::StandardButton::Yes) {
                emit onUseWholeImageRequested();
            }
        }
    }
}